

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O3

bool __thiscall
xercesc_4_0::TraverseSchema::isSubstitutionGroupValid
          (TraverseSchema *this,DOMElement *elem,SchemaElementDecl *subsElemDecl,
          ComplexTypeInfo *typeInfo,DatatypeValidator *validator,XMLCh *elemName,bool toEmit)

{
  uint uVar1;
  ComplexTypeInfo *pCVar2;
  DatatypeValidator *pDVar3;
  bool bVar4;
  int iVar5;
  int *piVar6;
  
  pCVar2 = subsElemDecl->fComplexTypeInfo;
  piVar6 = &pCVar2->fContentType;
  if (pCVar2 == (ComplexTypeInfo *)0x0) {
    piVar6 = (int *)&(subsElemDecl->super_XMLElementDecl).field_0x2c;
  }
  if (*piVar6 == 1) {
    if ((subsElemDecl->fFinalSet & 4) == 0) {
      return true;
    }
    bVar4 = true;
    if (typeInfo == (ComplexTypeInfo *)0x0 && validator == (DatatypeValidator *)0x0) {
      return true;
    }
    goto LAB_0033252d;
  }
  if (typeInfo == (ComplexTypeInfo *)0x0) {
    if (validator == (DatatypeValidator *)0x0) {
      return true;
    }
    if (pCVar2 == (ComplexTypeInfo *)0x0) {
      pDVar3 = subsElemDecl->fDatatypeValidator;
      if (pDVar3 == validator) {
        return true;
      }
      if (((pDVar3 != (DatatypeValidator *)0x0) &&
          (iVar5 = (*(pDVar3->super_XSerializable)._vptr_XSerializable[9])(pDVar3,validator),
          (char)iVar5 != '\0')) && ((subsElemDecl->fFinalSet & 4) == 0)) {
        return true;
      }
    }
  }
  else {
    if (pCVar2 == typeInfo) {
      return true;
    }
    uVar1 = typeInfo->fDerivedBy;
    if (pCVar2 == (ComplexTypeInfo *)0x0) {
      pDVar3 = subsElemDecl->fDatatypeValidator;
      if (typeInfo->fDatatypeValidator == pDVar3) {
        return true;
      }
      if ((pDVar3 != (DatatypeValidator *)0x0) &&
         (iVar5 = (*(pDVar3->super_XSerializable)._vptr_XSerializable[9])(), (char)iVar5 != '\0'))
      goto LAB_00332509;
    }
    else {
      do {
        typeInfo = typeInfo->fBaseComplexTypeInfo;
        if (typeInfo == (ComplexTypeInfo *)0x0) break;
      } while (typeInfo != pCVar2);
      if (typeInfo != (ComplexTypeInfo *)0x0) {
LAB_00332509:
        bVar4 = true;
        if ((subsElemDecl->fFinalSet & uVar1) == 0) {
          return true;
        }
        goto LAB_0033252d;
      }
    }
  }
  bVar4 = false;
LAB_0033252d:
  if (toEmit) {
    if (!bVar4) {
      reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLErrors",0x42,elemName,
                        (XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
      return false;
    }
    reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLErrors",0x41,elemName,
                      ((subsElemDecl->super_XMLElementDecl).fElementName)->fLocalPart,(XMLCh *)0x0,
                      (XMLCh *)0x0);
  }
  return false;
}

Assistant:

bool
TraverseSchema::isSubstitutionGroupValid(const DOMElement* const elem,
                                         const SchemaElementDecl* const subsElemDecl,
                                         const ComplexTypeInfo* const typeInfo,
                                         const DatatypeValidator* const validator,
                                         const XMLCh* const elemName,
                                         const bool toEmit) {

    // here we must do two things:
    // 1.  Make sure there actually *is* a relation between the types of
    // the element being nominated and the element doing the nominating;
    // (see PR 3.3.6 point #3 in the first tableau, for instance; this
    // and the corresponding tableaux from 3.4.6 and 3.14.6 rule out the nominated
    // element having an anonymous type declaration.
    // 2.  Make sure the nominated element allows itself to be nominated by
    // an element with the given type-relation.
    // Note:  we assume that (complex|simple)Type processing checks
    // whether the type in question allows itself to
    // be modified as this element desires.

    // if substitution element has any as content model type, return true
    bool subsRestricted = false;
    if (subsElemDecl->getModelType() == SchemaElementDecl::Any) {

        if ((subsElemDecl->getFinalSet() & SchemaSymbols::XSD_RESTRICTION) == 0
            || (typeInfo == 0 && validator == 0))
            return true;
        else
            subsRestricted = true;
    }
    // Check for type relationship;
    // that is, make sure that the type we're deriving has some relatoinship
    // to substitutionGroupElt's type.
    else if (typeInfo) { // do complexType case ...need testing

        ComplexTypeInfo* subsTypeInfo = subsElemDecl->getComplexTypeInfo();

        if (subsTypeInfo == typeInfo)
            return true;

        int derivationMethod = typeInfo->getDerivedBy();

        if (subsTypeInfo == 0) {  // take care of complexType based on simpleType case...

            DatatypeValidator* elemDV = typeInfo->getDatatypeValidator();
            DatatypeValidator* subsValidator = subsElemDecl->getDatatypeValidator();

            if (elemDV == subsValidator) {
                return true;
            }
            else if (subsValidator && subsValidator->isSubstitutableBy(elemDV)) {
                if ((subsElemDecl->getFinalSet() & derivationMethod) == 0) {
                    return true;
                }
                else {
                    subsRestricted = true;
                }
            }
        }
        else { // complex content

            const ComplexTypeInfo* elemTypeInfo = typeInfo;

            for (; elemTypeInfo && elemTypeInfo != subsTypeInfo;
                elemTypeInfo = elemTypeInfo->getBaseComplexTypeInfo()) {
            }

            if (elemTypeInfo) {
                if ((subsElemDecl->getFinalSet() & derivationMethod) == 0) {
                    return true;
                }
                else {
                    subsRestricted = true;
                }
            }
        }
    }
    else if (validator) { // do simpleType case...

        if (!subsElemDecl->getComplexTypeInfo()) {
            // first, check for type relation.
            DatatypeValidator* subsValidator = subsElemDecl->getDatatypeValidator();

            if (subsValidator == validator) {
                return true;
            }
            else if (subsValidator && subsValidator->isSubstitutableBy(validator)
                && ((subsElemDecl->getFinalSet() & SchemaSymbols::XSD_RESTRICTION) == 0)) {
                return true;
            }
        }
    }
    else // validator==0 && typeInfo==0 -- no checking
        return true;

    if (toEmit) {
        if (subsRestricted) {
            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::InvalidSubstitutionGroupElement,
                              elemName, subsElemDecl->getBaseName());
        }
        else {
            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::SubstitutionGroupTypeMismatch, elemName);
        }
    }

    return false;
}